

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O1

ps_latnode_t *
new_node(ps_lattice_t *dag,fsg_model_t *fsg,int sf,int ef,int32 wid,int32 node_id,int32 ascr)

{
  ps_latnode_t *ppVar1;
  
  for (ppVar1 = dag->nodes;
      (ppVar1 != (ps_latnode_t *)0x0 &&
      (((ppVar1->sf != (int)fsg || (ppVar1->wid != ef)) || (ppVar1->node_id != wid))));
      ppVar1 = ppVar1->next) {
  }
  if (ppVar1 == (ps_latnode_t *)0x0) {
    ppVar1 = (ps_latnode_t *)
             __listelem_malloc__(dag->latnode_alloc,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                                 ,0x4d5);
    ppVar1->wid = ef;
    ppVar1->sf = (int)fsg;
    ppVar1->lef = sf;
    ppVar1->fef = sf;
    ppVar1->reachable = 0;
    ppVar1->exits = (latlink_list_t *)0x0;
    ppVar1->entries = (latlink_list_t *)0x0;
    (ppVar1->info).fanin = node_id;
    ppVar1->node_id = wid;
    ppVar1->next = dag->nodes;
    dag->nodes = ppVar1;
    dag->n_nodes = dag->n_nodes + 1;
  }
  else {
    if (ppVar1->lef == -1 || ppVar1->lef < sf) {
      ppVar1->lef = sf;
    }
    if (ppVar1->fef == -1 || sf < ppVar1->fef) {
      ppVar1->fef = sf;
    }
    if ((ppVar1->info).fanin < node_id) {
      (ppVar1->info).fanin = node_id;
    }
  }
  return ppVar1;
}

Assistant:

static ps_latnode_t *
new_node(ps_lattice_t *dag, fsg_model_t *fsg, int sf, int ef, int32 wid, int32 node_id, int32 ascr)
{
    ps_latnode_t *node;

    node = find_node(dag, fsg, sf, wid, node_id);

    if (node) {
        /* Update end frames. */
        if (node->lef == -1 || node->lef < ef)
            node->lef = ef;
        if (node->fef == -1 || node->fef > ef)
            node->fef = ef;
        /* Update best link score. */
        if (ascr BETTER_THAN node->info.best_exit)
            node->info.best_exit = ascr;
    }
    else {
        /* New node; link to head of list */
        node = listelem_malloc(dag->latnode_alloc);
        node->wid = wid;
        node->sf = sf;
        node->fef = node->lef = ef;
        node->reachable = FALSE;
        node->entries = NULL;
        node->exits = NULL;
        node->info.best_exit = ascr;
        node->node_id = node_id;

        node->next = dag->nodes;
        dag->nodes = node;
        ++dag->n_nodes;
    }

    return node;
}